

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O2

void * touserdata(TValue *o)

{
  ushort uVar1;
  byte bVar2;
  long lVar3;
  
  bVar2 = o->tt_ & 0xf;
  if (bVar2 == 2) {
    return (o->value_).gc;
  }
  if (bVar2 == 7) {
    uVar1 = *(ushort *)((o->value_).f + 10);
    lVar3 = 0x20;
    if (uVar1 != 0) {
      lVar3 = (ulong)uVar1 * 0x10 + 0x28;
    }
    return (o->value_).f + lVar3;
  }
  return (void *)0x0;
}

Assistant:

l_sinline void *touserdata (const TValue *o) {
  switch (ttype(o)) {
    case LUA_TUSERDATA: return getudatamem(uvalue(o));
    case LUA_TLIGHTUSERDATA: return pvalue(o);
    default: return NULL;
  }
}